

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

TEdge * ClipperLib::GetMaximaPairEx(TEdge *e)

{
  TEdge *pTVar1;
  
  pTVar1 = GetMaximaPair(e);
  if ((pTVar1 != (TEdge *)0x0) &&
     ((pTVar1->OutIdx == -2 ||
      ((pTVar1->NextInAEL == pTVar1->PrevInAEL && ((pTVar1->Dx != -1e+40 || (NAN(pTVar1->Dx)))))))))
  {
    pTVar1 = (TEdge *)0x0;
  }
  return pTVar1;
}

Assistant:

TEdge *GetMaximaPairEx(TEdge *e)
{
  //as GetMaximaPair() but returns 0 if MaxPair isn't in AEL (unless it's horizontal)
  TEdge* result = GetMaximaPair(e);
  if (result && (result->OutIdx == Skip ||
    (result->NextInAEL == result->PrevInAEL && !IsHorizontal(*result)))) return 0;
  return result;
}